

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O0

size_t ZSTD_freeCDict(ZSTD_CDict *cdict)

{
  ZSTD_customMem customMem;
  ZSTD_customMem customMem_00;
  int iVar1;
  void *in_RDI;
  void *unaff_retaddr;
  int cdictInWorkspace;
  ZSTD_customMem cMem;
  uint in_stack_ffffffffffffffd0;
  undefined8 uVar2;
  ZSTD_cwksp *ws;
  undefined8 in_stack_fffffffffffffff8;
  
  if (in_RDI != (void *)0x0) {
    uVar2 = *(undefined8 *)((long)in_RDI + 0x1798);
    ws = *(ZSTD_cwksp **)((long)in_RDI + 0x17a0);
    iVar1 = ZSTD_cwksp_owns_buffer((ZSTD_cwksp *)((long)in_RDI + 0x20),in_RDI);
    customMem_00.customFree = (ZSTD_freeFunction)in_stack_fffffffffffffff8;
    customMem_00.customAlloc = (ZSTD_allocFunction)in_RDI;
    customMem_00.opaque = unaff_retaddr;
    ZSTD_cwksp_free(ws,customMem_00);
    if (iVar1 == 0) {
      customMem.customFree = (ZSTD_freeFunction)uVar2;
      customMem.customAlloc = (ZSTD_allocFunction)(ulong)in_stack_ffffffffffffffd0;
      customMem.opaque = ws;
      ZSTD_customFree(ws,customMem);
    }
  }
  return 0;
}

Assistant:

size_t ZSTD_freeCDict(ZSTD_CDict* cdict)
{
    if (cdict==NULL) return 0;   /* support free on NULL */
    {   ZSTD_customMem const cMem = cdict->customMem;
        int cdictInWorkspace = ZSTD_cwksp_owns_buffer(&cdict->workspace, cdict);
        ZSTD_cwksp_free(&cdict->workspace, cMem);
        if (!cdictInWorkspace) {
            ZSTD_customFree(cdict, cMem);
        }
        return 0;
    }
}